

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_add2hash(FIOBJ dest,char *name,size_t name_len,char *value,size_t value_len,uint8_t encoded
                 )

{
  int iVar1;
  int64_t num;
  double num_00;
  FIOBJ FStack_50;
  char *end;
  
  if (value_len == 5) {
    iVar1 = strncasecmp(value,"false",5);
    if (iVar1 == 0) {
      FStack_50 = 0x26;
      goto LAB_00140ca9;
    }
  }
  else if (value_len == 4) {
    iVar1 = strncasecmp(value,"true",4);
    if (iVar1 == 0) {
      FStack_50 = 0x16;
      goto LAB_00140ca9;
    }
    iVar1 = strncasecmp(value,"null",4);
    if (iVar1 == 0) {
      FStack_50 = 6;
      goto LAB_00140ca9;
    }
  }
  else if (value_len == 0) {
    FStack_50 = fiobj_str_new((char *)0x0,0);
    goto LAB_00140ca9;
  }
  end = value;
  num = fio_atol(&end);
  if (end == value + value_len) {
    FStack_50 = fiobj_num_new(num);
  }
  else {
    end = value;
    num_00 = fio_atof(&end);
    if (end == value + value_len) {
      FStack_50 = fiobj_float_new(num_00);
    }
    else if (encoded == '\0') {
      FStack_50 = fiobj_str_new(value,value_len);
    }
    else {
      FStack_50 = http_urlstr2fiobj(value,value_len);
    }
  }
LAB_00140ca9:
  iVar1 = http_add2hash2(dest,name,name_len,FStack_50,encoded);
  return iVar1;
}

Assistant:

int http_add2hash(FIOBJ dest, char *name, size_t name_len, char *value,
                  size_t value_len, uint8_t encoded) {
  return http_add2hash2(dest, name, name_len,
                        http_str2fiobj(value, value_len, encoded), encoded);
}